

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void * NULLC::AssertDerivedFrom(uint *derived,uint base)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint *puVar4;
  
  puVar4 = derived;
  if (derived != (uint *)0x0) {
    do {
      uVar1 = *puVar4;
      if (uVar1 == base) {
        return derived;
      }
      if (*(uint *)(linker + 0x20c) <= uVar1) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      puVar4 = (uint *)((ulong)uVar1 * 0x50 + *(long *)(linker + 0x200) + 0x4c);
    } while (*puVar4 != 0);
    pcVar2 = nullcGetTypeName(*derived);
    pcVar3 = nullcGetTypeName(base);
    nullcThrowError("ERROR: cannot convert from \'%s\' to \'%s\'",pcVar2,pcVar3);
  }
  return derived;
}

Assistant:

void* NULLC::AssertDerivedFrom(unsigned* derived, unsigned base)
{
	if(!derived)
		return derived;

	unsigned typeId = *derived;

	for(;;)
	{
		if(base == typeId)
			return derived;

		if(linker->exTypes[typeId].baseType)
		{
			typeId = linker->exTypes[typeId].baseType;
		}
		else
		{
			break;
		}
	}

	nullcThrowError("ERROR: cannot convert from '%s' to '%s'", nullcGetTypeName(*derived), nullcGetTypeName(base));
	return derived;
}